

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyDeepTiled.cpp
# Opt level: O3

void testCopyDeepTiled(string *tempDir)

{
  int iVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing raw copy in DeepTiledInput/OutputFile ",0x2e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  random_reseed(1);
  IlmThread_3_4::ThreadPool::globalThreadPool();
  IlmThread_3_4::ThreadPool::numThreads();
  iVar1 = IlmThread_3_4::ThreadPool::globalThreadPool();
  IlmThread_3_4::ThreadPool::setNumThreads(iVar1);
  anon_unknown.dwarf_e0908::readCopyWriteTest(3,1,tempDir);
  anon_unknown.dwarf_e0908::readCopyWriteTest(5,2,tempDir);
  anon_unknown.dwarf_e0908::readCopyWriteTest(0xb,3,tempDir);
  iVar1 = IlmThread_3_4::ThreadPool::globalThreadPool();
  IlmThread_3_4::ThreadPool::setNumThreads(iVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  return;
}

Assistant:

void
testCopyDeepTiled (const std::string& tempDir)
{
    try
    {
        cout << "Testing raw copy in DeepTiledInput/OutputFile " << endl;

        random_reseed (1);

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (2);

        readCopyWriteTest (3, 1, tempDir);
        readCopyWriteTest (5, 2, tempDir);
        readCopyWriteTest (11, 3, tempDir);

        ThreadPool::globalThreadPool ().setNumThreads (numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}